

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O1

unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_> *
inline_assertion_check<true,std::unique_ptr<wallet::SQliteExecHandler,std::default_delete<wallet::SQliteExecHandler>>&>
          (unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
           *val,char *file,int line,char *func,char *assertion)

{
  long lVar1;
  string_view func_00;
  string_view file_00;
  string_view assertion_00;
  size_t sVar2;
  char *pcVar3;
  char *unaff_RBP;
  size_t unaff_R15;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((val->_M_t).
      super___uniq_ptr_impl<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
      ._M_t.
      super__Tuple_impl<0UL,_wallet::SQliteExecHandler_*,_std::default_delete<wallet::SQliteExecHandler>_>
      .super__Head_base<0UL,_wallet::SQliteExecHandler_*,_false>._M_head_impl ==
      (SQliteExecHandler *)0x0) {
    sVar2 = strlen(file);
    strlen(func);
    pcVar3 = (char *)strlen(assertion);
    file_00._M_str = pcVar3;
    file_00._M_len = sVar2;
    func_00._M_str = in_stack_ffffffffffffffa8;
    func_00._M_len = (size_t)assertion;
    assertion_00._M_str = unaff_RBP;
    assertion_00._M_len = unaff_R15;
    assertion_fail(file_00,(int)((ulong)pcVar3 >> 0x20),func_00,assertion_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return val;
  }
  __stack_chk_fail();
}

Assistant:

T&& inline_assertion_check(LIFETIMEBOUND T&& val, [[maybe_unused]] const char* file, [[maybe_unused]] int line, [[maybe_unused]] const char* func, [[maybe_unused]] const char* assertion)
{
    if constexpr (IS_ASSERT
#ifdef ABORT_ON_FAILED_ASSUME
                  || true
#endif
    ) {
        if (!val) {
            assertion_fail(file, line, func, assertion);
        }
    }
    return std::forward<T>(val);
}